

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O0

undefined8 Game::Graphics::InputCommandListFooterPrompt_abi_cxx11_(void)

{
  char *pcVar1;
  const_iterator ppcVar2;
  ostream *poVar3;
  undefined8 in_RDI;
  char *txt;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<const_char_*> *__range2;
  ostringstream str_os;
  char *local_40;
  char *local_38;
  char *local_30;
  undefined1 local_28 [8];
  initializer_list<const_char_*> input_commands_list_footer_text;
  char *sp;
  
  input_commands_list_footer_text._M_len =
       (long)
       "\n   /\\\\\\\\\\\\\\\\\\          /\\\\\\\\\\\\\\                /\\\\\\         /\\\\\\\\\\\\\\\\\\\n  /\\\\\\///////\\\\\\      /\\\\\\/////\\\\\\            /\\\\\\\\\\       /\\\\\\///////\\\\\\\n  \\///      \\//\\\\\\    /\\\\\\    \\//\\\\\\         /\\\\\\/\\\\\\      \\/\\\\\\     \\/\\\\\\\n             /\\\\\\/    \\/\\\\\\     \\/\\\\\\       /\\\\\\/\\/\\\\\\      \\///\\\\\\\\\\\\\\\\\\/\n           /\\\\\\//      \\/\\\\\\     \\/\\\\\\     /\\\\\\/  \\/\\\\\\       /\\\\\\///////\\\\\\\n         /\\\\\\//         \\/\\\\\\     \\/\\\\\\   /\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\   /\\\\\\      \\//\\\\\\\n        /\\\\\\/            \\//\\\\\\    /\\\\\\   \\///////////\\\\\\//   \\//\\\\\\      /\\\\\\\n        /\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\   \\///\\\\\\\\\\\\\\/              \\/\\\\\\      \\///\\\\\\\\\\\\\\\\\\/\n        \\///////////////      \\///////                \\///         \\/////////\n  "
       + 0x2b0;
  local_40 = "";
  local_38 = "Press the keys to start and continue.";
  local_30 = "\n";
  local_28 = (undefined1  [8])&local_40;
  input_commands_list_footer_text._M_array = (iterator)0x3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2);
  __end2 = std::initializer_list<const_char_*>::begin((initializer_list<const_char_*> *)local_28);
  ppcVar2 = std::initializer_list<const_char_*>::end((initializer_list<const_char_*> *)local_28);
  for (; __end2 != ppcVar2; __end2 = __end2 + 1) {
    pcVar1 = *__end2;
    poVar3 = std::operator<<((ostream *)&__range2,"  ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    std::operator<<(poVar3,"\n");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2);
  return in_RDI;
}

Assistant:

std::string InputCommandListFooterPrompt() {
  constexpr auto sp = "  ";
  const auto input_commands_list_footer_text = {
      "", "Press the keys to start and continue.", "\n"};
  std::ostringstream str_os;
  for (const auto txt : input_commands_list_footer_text) {
    str_os << sp << txt << "\n";
  }
  return str_os.str();
}